

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpGetHttpResponse(void *handle,UpnpString *headers,char **contentType,int *contentLength,
                       int *httpStatus,int timeout)

{
  http_parser_t *parser;
  int iVar1;
  parse_status_t pVar2;
  http_header_t *phVar3;
  int iStack_40;
  int iStack_3c;
  memptr mStack_38;
  
  parser = (http_parser_t *)((long)handle + 0x90);
  iStack_3c = timeout;
  iVar1 = ReadResponseLineAndHeaders((SOCKINFO *)handle,parser,&iStack_3c,&iStack_40);
  if ((iVar1 != 4) ||
     ((pVar2 = parser_get_entity_read_method(parser), pVar2 != PARSE_CONTINUE_1 &&
      (pVar2 != PARSE_SUCCESS)))) {
    httpmsg_destroy((http_message_t *)parser);
    return -0x71;
  }
  if (httpStatus != (int *)0x0) {
    *httpStatus = *(int *)((long)handle + 0x16c);
  }
  if (contentType != (char **)0x0) {
    phVar3 = httpmsg_find_hdr((http_message_t *)parser,4,&mStack_38);
    if (phVar3 != (http_header_t *)0x0) {
      phVar3 = (http_header_t *)mStack_38.buf;
    }
    *contentType = (char *)phVar3;
  }
  if (contentLength == (int *)0x0) {
    return 0;
  }
  if (*(int *)((long)handle + 0x248) == 4) {
    *contentLength = 0;
    return 0;
  }
  iVar1 = *(int *)((long)handle + 0x24c);
  if (iVar1 == 2) {
    *contentLength = *(int *)((long)handle + 0x250);
    return 0;
  }
  if (iVar1 == 4) {
    *contentLength = -4;
    return 0;
  }
  if (iVar1 != 3) {
    return 0;
  }
  *contentLength = -3;
  return 0;
}

Assistant:

int UpnpGetHttpResponse(void *handle,
	UpnpString *headers,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	return http_GetHttpResponse(handle,
		headers,
		contentType,
		contentLength,
		httpStatus,
		timeout);
}